

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

bool __thiscall slang::ast::Type::isFourState(Type *this)

{
  SymbolKind SVar1;
  SyntaxNode *pSVar2;
  bool bVar3;
  bool bVar4;
  Type *pTVar5;
  Type *pTVar6;
  long lVar7;
  
  while( true ) {
    pTVar5 = getCanonicalType(this);
    pTVar6 = getCanonicalType(pTVar5);
    bVar3 = IntegralType::isKind((pTVar6->super_Symbol).kind);
    if (bVar3) {
      return (bool)pTVar5[1].super_Symbol.field_0x5;
    }
    pTVar6 = getCanonicalType(pTVar5);
    if (5 < (pTVar6->super_Symbol).kind - PackedArrayType) break;
    this = getArrayElementType(pTVar5);
  }
  SVar1 = (pTVar5->super_Symbol).kind;
  if (SVar1 == UnpackedUnionType) {
    pTVar6 = pTVar5[1].canonical;
    bVar3 = pTVar6 != (Type *)0x0;
    if (pTVar6 == (Type *)0x0) {
      return bVar3;
    }
    pSVar2 = pTVar5[1].super_Symbol.originatingSyntax;
    pTVar5 = DeclaredType::getType((DeclaredType *)(*(long *)pSVar2 + 0x40));
    bVar4 = isFourState(pTVar5);
    if (!bVar4) {
      lVar7 = 8;
      do {
        bVar4 = (long)pTVar6 << 3 == lVar7;
        bVar3 = !bVar4;
        if (bVar4) {
          return bVar3;
        }
        pTVar5 = DeclaredType::getType
                           ((DeclaredType *)(*(long *)((long)&pSVar2->kind + lVar7) + 0x40));
        bVar4 = isFourState(pTVar5);
        lVar7 = lVar7 + 8;
      } while (!bVar4);
      return bVar3;
    }
    return bVar3;
  }
  if (SVar1 != UnpackedStructType) {
    return false;
  }
  pTVar6 = pTVar5[1].canonical;
  bVar3 = pTVar6 != (Type *)0x0;
  if (bVar3) {
    pSVar2 = pTVar5[1].super_Symbol.originatingSyntax;
    pTVar5 = DeclaredType::getType((DeclaredType *)(*(long *)pSVar2 + 0x40));
    bVar4 = isFourState(pTVar5);
    if (bVar4) {
      return bVar3;
    }
    lVar7 = 8;
    do {
      bVar4 = (long)pTVar6 << 3 == lVar7;
      bVar3 = !bVar4;
      if (bVar4) {
        return bVar3;
      }
      pTVar5 = DeclaredType::getType
                         ((DeclaredType *)(*(long *)((long)&pSVar2->kind + lVar7) + 0x40));
      bVar4 = isFourState(pTVar5);
      lVar7 = lVar7 + 8;
    } while (!bVar4);
    return bVar3;
  }
  return bVar3;
}

Assistant:

bool Type::isFourState() const {
    const Type& ct = getCanonicalType();
    if (ct.isIntegral())
        return ct.as<IntegralType>().isFourState;

    if (ct.isArray())
        return ct.getArrayElementType()->isFourState();

    switch (ct.kind) {
        case SymbolKind::UnpackedStructType: {
            auto& us = ct.as<UnpackedStructType>();
            for (auto field : us.fields) {
                if (field->getType().isFourState())
                    return true;
            }
            return false;
        }
        case SymbolKind::UnpackedUnionType: {
            auto& us = ct.as<UnpackedUnionType>();
            for (auto field : us.fields) {
                if (field->getType().isFourState())
                    return true;
            }
            return false;
        }
        default:
            return false;
    }
}